

Human: Reconstruct the original C/C++ source from this Ghidra decompilation:

# bzlib.c
# Opt level: O0

int BZ2_bzwrite(BZFILE *b,void *buf,int len)

{
  int in_EDX;
  undefined8 in_RSI;
  void *in_RDI;
  int *unaff_retaddr;
  int bzerr;
  undefined4 local_20;
  undefined4 in_stack_fffffffffffffff8;
  undefined4 in_stack_fffffffffffffffc;
  
  BZ2_bzWrite(unaff_retaddr,(BZFILE *)CONCAT44(in_stack_fffffffffffffffc,in_stack_fffffffffffffff8),
              in_RDI,(int)((ulong)in_RSI >> 0x20));
  if (local_20 != 0) {
    in_EDX = -1;
  }
  return in_EDX;
}

Assistant:

int BZ_API(BZ2_bzwrite) (BZFILE* b, void* buf, int len )
{
   int bzerr;

   BZ2_bzWrite(&bzerr,b,buf,len);
   if(bzerr == BZ_OK){
      return len;
   }else{
      return -1;
   }
}